

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O0

int __thiscall
calc4::anon_unknown_0::Visitor<__int128>::ProcessOperator
          (Visitor<__int128> *this,shared_ptr<const_calc4::Operator> *op)

{
  int iVar1;
  element_type *peVar2;
  reference pvVar3;
  undefined8 in_RDI;
  int result;
  
  peVar2 = std::__shared_ptr_access<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1392a2);
  (**peVar2->_vptr_Operator)(peVar2,in_RDI);
  pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                     ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x1392bd);
  iVar1 = *pvVar3;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x1392d1);
  return iVar1;
}

Assistant:

int ProcessOperator(const std::shared_ptr<const Operator>& op)
    {
        op->Accept(*this);
        int result = stack.top();
        stack.pop();
        return result;
    }